

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int64_t gmfopenmeshf77_(char *FilNam,int *mod,int *ver,int *dim,long StrSiz)

{
  ushort **ppuVar1;
  uint *in_RCX;
  uint *in_RDX;
  int *in_RSI;
  long in_RDI;
  long in_R8;
  char TmpNam [1024];
  int i;
  char acStack_438 [1028];
  int local_34;
  long local_30;
  uint *local_28;
  uint *local_20;
  int *local_18;
  long local_10;
  int64_t local_8;
  
  local_34 = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_R8 < 1) {
    local_8 = 0;
  }
  else {
    while (ppuVar1 = __ctype_b_loc(),
          ((*ppuVar1)[(int)*(char *)(local_10 + local_30 + -1)] & 0x2000) != 0) {
      local_30 = local_30 + -1;
    }
    for (local_34 = 0; local_34 < local_30; local_34 = local_34 + 1) {
      acStack_438[local_34] = *(char *)(local_10 + local_34);
    }
    acStack_438[local_30] = '\0';
    if (*local_18 == 1) {
      local_8 = GmfOpenMesh(acStack_438,1,local_20,local_28);
    }
    else {
      local_8 = GmfOpenMesh(acStack_438,2,(ulong)*local_20,(ulong)*local_28);
    }
  }
  return local_8;
}

Assistant:

int64_t APIF77(gmfopenmeshf77)(  char *FilNam, int *mod,
                                 int *ver, int *dim, long int StrSiz )
{
   int   i = 0;
   char  TmpNam[ GmfStrSiz ];

   if(StrSiz <= 0)
      return(0);

   // Trim trailing spaces from the fortran string
   while(isspace(FilNam[ StrSiz-1 ]))
      StrSiz--;

   for(i=0;i<StrSiz;i++)
      TmpNam[i] = FilNam[i];

   TmpNam[ StrSiz ] = 0;

   if(*mod == GmfRead)
      return(GmfOpenMesh(TmpNam, GmfRead, ver, dim));
   else
      return(GmfOpenMesh(TmpNam, GmfWrite, *ver, *dim));
}